

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# creadhb.c
# Opt level: O3

int cReadValues(FILE *fp,int n,singlecomplex *destination,int perline,int persize)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  char buf [100];
  float local_bc;
  byte local_98 [104];
  
  if (0 < n) {
    iVar6 = 0;
    bVar3 = false;
    do {
      fgets((char *)local_98,100,(FILE *)fp);
      if (0 < perline) {
        uVar7 = 0;
        lVar4 = 0;
        do {
          lVar1 = lVar4 + 1;
          lVar8 = lVar1 * persize;
          bVar2 = local_98[lVar8];
          local_98[lVar8] = 0;
          if (0 < persize) {
            uVar5 = 0;
            do {
              if ((local_98[uVar5 + uVar7] | 0x20) == 100) {
                local_98[uVar5 + uVar7] = 0x45;
              }
              uVar5 = uVar5 + 1;
            } while ((uint)persize != uVar5);
          }
          lVar4 = lVar4 * persize;
          if (bVar3) {
            destination[iVar6].r = local_bc;
            dVar9 = atof((char *)(local_98 + lVar4));
            destination[iVar6].i = (float)dVar9;
            iVar6 = iVar6 + 1;
          }
          else {
            dVar9 = atof((char *)(local_98 + lVar4));
            local_bc = (float)dVar9;
          }
          bVar3 = !bVar3;
          local_98[lVar8] = bVar2;
        } while ((lVar1 < perline) &&
                (uVar7 = (ulong)(uint)((int)uVar7 + persize), lVar4 = lVar1, iVar6 < n));
      }
    } while (iVar6 < n);
  }
  return 0;
}

Assistant:

int cReadValues(FILE *fp, int n, singlecomplex *destination, int perline, int persize)
{
    register int i, j, k, s, pair;
    register float realpart;
    char tmp, buf[100];
    
    i = pair = 0;
    while (i < n) {
	fgets(buf, 100, fp);    /* read a line at a time */
	for (j=0; j<perline && i<n; j++) {
	    tmp = buf[(j+1)*persize];     /* save the char at that place */
	    buf[(j+1)*persize] = 0;       /* null terminate */
	    s = j*persize;
	    for (k = 0; k < persize; ++k) /* No D_ format in C */
		if ( buf[s+k] == 'D' || buf[s+k] == 'd' ) buf[s+k] = 'E';
	    if ( pair == 0 ) {
	  	/* The value is real part */
		realpart = atof(&buf[s]);
		pair = 1;
	    } else {
		/* The value is imaginary part */
	        destination[i].r = realpart;
		destination[i++].i = atof(&buf[s]);
		pair = 0;
	    }
	    buf[(j+1)*persize] = tmp;     /* recover the char at that place */
	}
    }

    return 0;
}